

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_test.c
# Opt level: O3

void test_msg_pipe(void)

{
  nng_err num;
  int iVar1;
  uint uVar2;
  nng_pipe nVar3;
  int iVar4;
  char *pcVar5;
  nng_msg *local_20;
  nng_msg *msg;
  
  num = nng_msg_alloc(&local_20,0);
  pcVar5 = nng_strerror(num);
  iVar1 = acutest_check_((uint)(num == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                         ,0xaf,"%s: expected success, got %s (%d)","nng_msg_alloc(&msg, 0)",pcVar5,
                         num);
  if (iVar1 != 0) {
    uVar2 = nng_pipe_id((nng_pipe)0x0);
    iVar1 = acutest_check_(uVar2 >> 0x1f,
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                           ,0xb3,"%s","nng_pipe_id(p0) < 0");
    if (iVar1 != 0) {
      nVar3 = nng_msg_get_pipe(local_20);
      uVar2 = nng_pipe_id(nVar3);
      iVar1 = acutest_check_(uVar2 >> 0x1f,
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                             ,0xb5,"%s","nng_pipe_id(p) < 0");
      if (iVar1 != 0) {
        nng_msg_set_pipe(local_20,(nng_pipe)0x22222222);
        nVar3 = nng_msg_get_pipe(local_20);
        iVar1 = nng_pipe_id(nVar3);
        iVar4 = nng_pipe_id((nng_pipe)0x0);
        iVar1 = acutest_check_((uint)(iVar1 != iVar4),
                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                               ,0xb9,"%s","nng_pipe_id(p) != nng_pipe_id(p0)");
        if (iVar1 != 0) {
          iVar1 = nng_pipe_id(nVar3);
          iVar1 = acutest_check_((uint)(iVar1 == 0x22222222),
                                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                                 ,0xba,"%s","nng_pipe_id(p) == 0x22222222");
          if (iVar1 != 0) {
            nng_msg_free(local_20);
            return;
          }
        }
      }
    }
  }
  acutest_abort_();
}

Assistant:

void
test_msg_pipe(void)
{
	nng_msg *msg;
	NUTS_PASS(nng_msg_alloc(&msg, 0));
	nng_pipe p  = NNG_PIPE_INITIALIZER;
	nng_pipe p0 = NNG_PIPE_INITIALIZER;

	NUTS_ASSERT(nng_pipe_id(p0) < 0);
	p = nng_msg_get_pipe(msg);
	NUTS_ASSERT(nng_pipe_id(p) < 0);
	memset(&p, 0x22, sizeof(p));
	nng_msg_set_pipe(msg, p);
	p = nng_msg_get_pipe(msg);
	NUTS_ASSERT(nng_pipe_id(p) != nng_pipe_id(p0));
	NUTS_ASSERT(nng_pipe_id(p) == 0x22222222);

	nng_msg_free(msg);
}